

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sliced_Wasserstein.h
# Opt level: O0

double __thiscall
Gudhi::Persistence_representations::Sliced_Wasserstein::compute_int_cos
          (Sliced_Wasserstein *this,double alpha,double beta)

{
  double dVar1;
  double local_28;
  double res;
  double beta_local;
  double alpha_local;
  Sliced_Wasserstein *this_local;
  
  local_28 = 0.0;
  if ((0.0 <= alpha) && (alpha <= 3.141592653589793)) {
    dVar1 = cos(alpha);
    if (dVar1 < 0.0) {
      if (beta < 4.71238898038469) {
        local_28 = sin(alpha);
        dVar1 = sin(beta);
        local_28 = local_28 - dVar1;
      }
      else {
        dVar1 = sin(alpha);
        local_28 = sin(beta);
        local_28 = dVar1 + 2.0 + local_28;
      }
    }
    else if (beta < 1.5707963267948966) {
      local_28 = sin(beta);
      dVar1 = sin(alpha);
      local_28 = local_28 - dVar1;
    }
    else {
      dVar1 = sin(alpha);
      local_28 = sin(beta);
      local_28 = (2.0 - dVar1) - local_28;
    }
  }
  if ((-3.141592653589793 <= alpha) && (alpha <= 0.0)) {
    dVar1 = cos(alpha);
    if (0.0 < dVar1) {
      if (beta < 1.5707963267948966) {
        local_28 = sin(beta);
        dVar1 = sin(alpha);
        local_28 = local_28 - dVar1;
      }
      else {
        dVar1 = sin(alpha);
        local_28 = sin(beta);
        local_28 = (2.0 - dVar1) - local_28;
      }
    }
    else if (beta < -1.5707963267948966) {
      local_28 = sin(alpha);
      dVar1 = sin(beta);
      local_28 = local_28 - dVar1;
    }
    else {
      dVar1 = sin(alpha);
      local_28 = sin(beta);
      local_28 = dVar1 + 2.0 + local_28;
    }
  }
  return local_28;
}

Assistant:

double compute_int_cos(double alpha, double beta) const {
    double res = 0;
    if (alpha >= 0 && alpha <= pi) {
      if (cos(alpha) >= 0) {
        if (pi / 2 <= beta) {
          res = 2 - sin(alpha) - sin(beta);
        } else {
          res = sin(beta) - sin(alpha);
        }
      } else {
        if (1.5 * pi <= beta) {
          res = 2 + sin(alpha) + sin(beta);
        } else {
          res = sin(alpha) - sin(beta);
        }
      }
    }
    if (alpha >= -pi && alpha <= 0) {
      if (cos(alpha) <= 0) {
        if (-pi / 2 <= beta) {
          res = 2 + sin(alpha) + sin(beta);
        } else {
          res = sin(alpha) - sin(beta);
        }
      } else {
        if (pi / 2 <= beta) {
          res = 2 - sin(alpha) - sin(beta);
        } else {
          res = sin(beta) - sin(alpha);
        }
      }
    }
    return res;
  }